

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

QPolygonF * __thiscall
QGraphicsView::mapToScene(QPolygonF *__return_storage_ptr__,QGraphicsView *this,QRect *rect)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  QGraphicsViewPrivate *this_00;
  undefined4 uVar4;
  QPointF *b;
  QPointF *pQVar5;
  pointer pQVar6;
  long lVar7;
  qreal *pqVar8;
  long in_FS_OFFSET;
  byte bVar9;
  qreal qVar10;
  qreal qVar11;
  double dVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  double dVar16;
  QArrayData *d;
  QPointF local_70 [5];
  long local_20;
  
  bVar9 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((rect->x2).m_i < (rect->x1).m_i) || ((rect->y2).m_i < (rect->y1).m_i)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_0063d3a4;
    (__return_storage_ptr__->super_QList<QPointF>).d.d = (Data *)0x0;
    (__return_storage_ptr__->super_QList<QPointF>).d.ptr = (QPointF *)0x0;
    (__return_storage_ptr__->super_QList<QPointF>).d.size = 0;
  }
  else {
    this_00 = *(QGraphicsViewPrivate **)(this + 8);
    if ((this_00->field_0x300 & 0x20) != 0) {
      QGraphicsViewPrivate::updateScroll(this_00);
    }
    dVar16 = (double)this_00->scrollX;
    if ((this_00->field_0x300 & 0x20) != 0) {
      QGraphicsViewPrivate::updateScroll(this_00);
    }
    uVar13 = 0xffffffff;
    uVar14 = 0xffffffff;
    uVar3 = rect->x1;
    uVar4 = rect->y1;
    dVar15 = (double)(int)uVar4 + (double)this_00->scrollY;
    uVar1 = rect->x2;
    uVar2 = rect->y2;
    dVar12 = (double)(uVar2 + 1) + (double)this_00->scrollY;
    (__return_storage_ptr__->super_QList<QPointF>).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->super_QList<QPointF>).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->super_QList<QPointF>).d.ptr = (QPointF *)&DAT_aaaaaaaaaaaaaaaa;
    local_70[0].xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    pQVar5 = (QPointF *)QArrayData::allocate((QArrayData **)local_70,0x10,0x10,4,KeepSize);
    (__return_storage_ptr__->super_QList<QPointF>).d.d = (Data *)local_70[0].xp;
    (__return_storage_ptr__->super_QList<QPointF>).d.ptr = pQVar5;
    pQVar5[3].xp = 0.0;
    pQVar5[3].yp = 0.0;
    pQVar5[2].xp = 0.0;
    pQVar5[2].yp = 0.0;
    pQVar5[1].xp = 0.0;
    pQVar5[1].yp = 0.0;
    pQVar5->xp = 0.0;
    pQVar5->yp = 0.0;
    (__return_storage_ptr__->super_QList<QPointF>).d.size = 4;
    if ((this_00->field_0x300 & 0x10) == 0) {
      pqVar8 = (qreal *)&DAT_00704bf8;
      pQVar5 = local_70;
      for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
        pQVar5->xp = *pqVar8;
        pqVar8 = pqVar8 + (ulong)bVar9 * -2 + 1;
        pQVar5 = (QPointF *)&pQVar5[-(ulong)bVar9].yp;
      }
      QTransform::inverted((bool *)local_70);
      qVar10 = (qreal)QTransform::map(local_70);
      qVar11 = (qreal)CONCAT44(uVar14,uVar13);
      pQVar6 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar6->xp = qVar10;
      pQVar6->yp = qVar11;
      qVar10 = (qreal)QTransform::map(local_70);
      qVar11 = (qreal)CONCAT44(uVar14,uVar13);
      pQVar6 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar6[1].xp = qVar10;
      pQVar6[1].yp = qVar11;
      qVar10 = (qreal)QTransform::map(local_70);
      qVar11 = (qreal)CONCAT44(uVar14,uVar13);
      pQVar6 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar6[2].xp = qVar10;
      pQVar6[2].yp = qVar11;
      qVar11 = (qreal)QTransform::map(local_70);
      pQVar6 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar6[3].xp = qVar11;
      pQVar6[3].yp = (qreal)CONCAT44(uVar14,uVar13);
    }
    else {
      pQVar6 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar6->xp = (double)(int)uVar3 + dVar16;
      pQVar6->yp = dVar15;
      pQVar6 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar6[1].xp = (double)(uVar1 + 1) + dVar16;
      pQVar6[1].yp = dVar15;
      pQVar6 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar6[2].xp = (double)(uVar1 + 1) + dVar16;
      pQVar6[2].yp = dVar12;
      pQVar6 = QList<QPointF>::data(&__return_storage_ptr__->super_QList<QPointF>);
      pQVar6[3].xp = (double)(int)uVar3 + dVar16;
      pQVar6[3].yp = dVar12;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_0063d3a4:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QPolygonF QGraphicsView::mapToScene(const QRect &rect) const
{
    Q_D(const QGraphicsView);
    if (!rect.isValid())
        return QPolygonF();

    QPointF scrollOffset(d->horizontalScroll(), d->verticalScroll());
    QRect r = rect.adjusted(0, 0, 1, 1);
    QPointF tl = scrollOffset + r.topLeft();
    QPointF tr = scrollOffset + r.topRight();
    QPointF br = scrollOffset + r.bottomRight();
    QPointF bl = scrollOffset + r.bottomLeft();

    QPolygonF poly(4);
    if (!d->identityMatrix) {
        QTransform x = d->matrix.inverted();
        poly[0] = x.map(tl);
        poly[1] = x.map(tr);
        poly[2] = x.map(br);
        poly[3] = x.map(bl);
    } else {
        poly[0] = tl;
        poly[1] = tr;
        poly[2] = br;
        poly[3] = bl;
    }
    return poly;
}